

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  int kk_10;
  float *p0_10;
  __m128 _tmp1_4;
  __m128 _tmp0_4;
  __m128 _r1_5;
  __m128 _r0_5;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_9;
  float *p1_6;
  float *p0_9;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_8;
  float *p3_3;
  float *p2_3;
  float *p1_5;
  float *p0_8;
  int kk_7;
  float *p0_7;
  __m256 _r7_1;
  __m256 _r6_1;
  __m256 _r5_1;
  __m256 _r4_1;
  __m256 _r3_1;
  __m256 _r2_1;
  __m256 _r1_1;
  __m256 _r0_1;
  int kk_6;
  float *p7_1;
  float *p6_1;
  float *p5_1;
  float *p4_1;
  float *p3_2;
  float *p2_2;
  float *p1_4;
  float *p0_6;
  int kk_5;
  float *p1_3;
  float *p0_5;
  int kk_4;
  float *p0_4;
  __m512 _rf;
  __m512 _re;
  __m512 _rd;
  __m512 _rc;
  __m512 _rb;
  __m512 _ra;
  __m512 _r9;
  __m512 _r8;
  __m512 _r7;
  __m512 _r6;
  __m512 _r5;
  __m512 _r4;
  __m512 _r3;
  __m512 _r2;
  __m512 _r1;
  __m512 _r0;
  int kk_3;
  float *pf;
  float *pe;
  float *pd;
  float *pc;
  float *pb;
  float *pa;
  float *p9;
  float *p8;
  float *p7;
  float *p6;
  float *p5;
  float *p4;
  float *p3_1;
  float *p2_1;
  float *p1_2;
  float *p0_3;
  int kk_2;
  float *p3;
  float *p2;
  float *p1_1;
  float *p0_2;
  int kk_1;
  float *p1;
  float *p0_1;
  int kk;
  float *p0;
  int ii;
  float *pp;
  int A_hstep;
  int elempack;
  __m512 _tmpv;
  __m512 _tmpu;
  __m512 _tmpt;
  __m512 _tmps;
  __m512 _tmpr;
  __m512 _tmpq;
  __m512 _tmpp;
  __m512 _tmpo;
  __m512 _tmpn;
  __m512 _tmpm;
  __m512 _tmpl;
  __m512 _tmpk;
  __m512 _tmpj;
  __m512 _tmpi;
  __m512 _tmph;
  __m512 _tmpg;
  __m512 _tmpf;
  __m512 _tmpe;
  __m512 _tmpd;
  __m512 _tmpc;
  __m512 _tmpb;
  __m512 _tmpa;
  __m512 _tmp9;
  __m512 _tmp8;
  __m512 _tmp7;
  __m512 _tmp6;
  __m512 _tmp5;
  __m512 _tmp4;
  __m512 _tmp3;
  __m512 _tmp2;
  __m512 _tmp1;
  __m512 _tmp0;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  int local_3370;
  int local_336c;
  undefined1 (*local_3368) [32];
  undefined8 local_3350;
  undefined8 uStack_3348;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  int local_32d4;
  undefined1 (*local_32d0) [32];
  undefined1 (*local_32c8) [32];
  undefined8 local_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 local_3250;
  undefined8 uStack_3248;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  int local_31b4;
  undefined1 (*local_31b0) [32];
  undefined1 (*local_31a8) [32];
  undefined1 (*local_31a0) [32];
  undefined1 (*local_3198) [32];
  int local_318c;
  undefined1 (*local_3188) [16];
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  int local_306c;
  undefined1 (*local_3068) [32];
  undefined1 (*local_3060) [32];
  undefined1 (*local_3058) [32];
  undefined1 (*local_3050) [32];
  undefined1 (*local_3048) [32];
  undefined1 (*local_3040) [32];
  undefined1 (*local_3038) [32];
  undefined1 (*local_3030) [32];
  int local_3024;
  undefined1 (*local_3020) [16];
  undefined8 *local_3018;
  int local_300c;
  undefined1 (*local_3008) [32];
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 uStack_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  int local_2bec;
  undefined1 (*local_2be8) [64];
  undefined1 (*local_2be0) [64];
  undefined1 (*local_2bd8) [64];
  undefined1 (*local_2bd0) [64];
  undefined1 (*local_2bc8) [64];
  undefined1 (*local_2bc0) [64];
  undefined1 (*local_2bb8) [64];
  undefined1 (*local_2bb0) [64];
  undefined1 (*local_2ba8) [64];
  undefined1 (*local_2ba0) [64];
  undefined1 (*local_2b98) [64];
  undefined1 (*local_2b90) [64];
  undefined1 (*local_2b88) [64];
  undefined1 (*local_2b80) [64];
  undefined1 (*local_2b78) [64];
  undefined1 (*local_2b70) [64];
  int local_2b64;
  undefined1 (*local_2b60) [16];
  undefined8 *local_2b58;
  undefined8 *local_2b50;
  undefined8 *local_2b48;
  int local_2b3c;
  undefined1 (*local_2b38) [32];
  undefined8 *local_2b30;
  int local_2b24;
  undefined1 (*local_2b20) [64];
  int local_2b14;
  undefined1 (*local_2b10) [64];
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_3370 = (int)in_RDI[8];
  }
  else {
    local_3370 = *(int *)((long)in_RDI + 0x2c);
  }
  local_2b10 = (undefined1 (*) [64])*in_RSI;
  for (local_2b14 = 0; local_2b14 + 0xf < in_ECX; local_2b14 = local_2b14 + 0x10) {
    if (iVar1 == 0x10) {
      local_2b20 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 4) * 4);
      for (local_2b24 = 0; local_2b24 < in_R9D; local_2b24 = local_2b24 + 1) {
        *local_2b10 = *local_2b20;
        local_2b10 = local_2b10 + 1;
        local_2b20 = local_2b20 + 1;
      }
    }
    if (iVar1 == 8) {
      local_2b30 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 3) * 4);
      local_2b38 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 8) * local_3370) * 4 +
                   (long)(in_R8D << 3) * 4);
      for (local_2b3c = 0; local_2b3c < in_R9D; local_2b3c = local_2b3c + 1) {
        uVar17 = local_2b30[1];
        uVar18 = local_2b30[2];
        uVar19 = local_2b30[3];
        *(undefined8 *)*local_2b10 = *local_2b30;
        *(undefined8 *)(*local_2b10 + 8) = uVar17;
        *(undefined8 *)(*local_2b10 + 0x10) = uVar18;
        *(undefined8 *)(*local_2b10 + 0x18) = uVar19;
        *(undefined1 (*) [32])(*local_2b10 + 0x20) = *local_2b38;
        local_2b10 = local_2b10 + 1;
        local_2b30 = local_2b30 + 4;
        local_2b38 = local_2b38 + 1;
      }
    }
    if (iVar1 == 4) {
      local_2b48 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2b50 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2b14 + 4) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2b58 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2b14 + 8) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2b60 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xc) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_2b64 = 0; local_2b64 < in_R9D; local_2b64 = local_2b64 + 1) {
        uVar17 = local_2b48[1];
        *(undefined8 *)*local_2b10 = *local_2b48;
        *(undefined8 *)(*local_2b10 + 8) = uVar17;
        uVar17 = local_2b50[1];
        *(undefined8 *)(*local_2b10 + 0x10) = *local_2b50;
        *(undefined8 *)(*local_2b10 + 0x18) = uVar17;
        uVar17 = local_2b58[1];
        *(undefined8 *)(*local_2b10 + 0x20) = *local_2b58;
        *(undefined8 *)(*local_2b10 + 0x28) = uVar17;
        *(undefined1 (*) [16])(*local_2b10 + 0x30) = *local_2b60;
        local_2b10 = local_2b10 + 1;
        local_2b48 = local_2b48 + 2;
        local_2b50 = local_2b50 + 2;
        local_2b58 = local_2b58 + 2;
        local_2b60 = local_2b60 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2b70 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 + (long)in_R8D * 4);
      local_2b78 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 1) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2b80 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 2) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2b88 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 3) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2b90 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 4) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2b98 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 5) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2ba0 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 6) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2ba8 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 7) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2bb0 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 8) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2bb8 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 9) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_2bc0 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 10) * local_3370) * 4 + (long)in_R8D * 4
                   );
      local_2bc8 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xb) * local_3370) * 4 +
                   (long)in_R8D * 4);
      local_2bd0 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xc) * local_3370) * 4 +
                   (long)in_R8D * 4);
      local_2bd8 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xd) * local_3370) * 4 +
                   (long)in_R8D * 4);
      local_2be0 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xe) * local_3370) * 4 +
                   (long)in_R8D * 4);
      local_2be8 = (undefined1 (*) [64])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 0xf) * local_3370) * 4 +
                   (long)in_R8D * 4);
      for (local_2bec = 0; local_2bec + 0xf < in_R9D; local_2bec = local_2bec + 0x10) {
        auVar20 = vunpcklps_avx512f(*local_2b70,*local_2b78);
        auVar21 = vunpckhps_avx512f(*local_2b70,*local_2b78);
        auVar22 = vunpcklps_avx512f(*local_2b80,*local_2b88);
        auVar23 = vunpckhps_avx512f(*local_2b80,*local_2b88);
        auVar24 = vunpcklps_avx512f(*local_2b90,*local_2b98);
        auVar25 = vunpckhps_avx512f(*local_2b90,*local_2b98);
        auVar26 = vunpcklps_avx512f(*local_2ba0,*local_2ba8);
        auVar27 = vunpckhps_avx512f(*local_2ba0,*local_2ba8);
        auVar28 = vunpcklps_avx512f(*local_2bb0,*local_2bb8);
        auVar29 = vunpckhps_avx512f(*local_2bb0,*local_2bb8);
        auVar30 = vunpcklps_avx512f(*local_2bc0,*local_2bc8);
        auVar31 = vunpckhps_avx512f(*local_2bc0,*local_2bc8);
        auVar32 = vunpcklps_avx512f(*local_2bd0,*local_2bd8);
        auVar33 = vunpckhps_avx512f(*local_2bd0,*local_2bd8);
        auVar34 = vunpcklps_avx512f(*local_2be0,*local_2be8);
        auVar35 = vunpckhps_avx512f(*local_2be0,*local_2be8);
        auVar36 = vunpcklpd_avx512f(auVar20,auVar22);
        auVar20 = vunpckhpd_avx512f(auVar20,auVar22);
        auVar22 = vunpcklpd_avx512f(auVar21,auVar23);
        auVar21 = vunpckhpd_avx512f(auVar21,auVar23);
        auVar23 = vunpcklpd_avx512f(auVar24,auVar26);
        auVar24 = vunpckhpd_avx512f(auVar24,auVar26);
        auVar26 = vunpcklpd_avx512f(auVar25,auVar27);
        auVar25 = vunpckhpd_avx512f(auVar25,auVar27);
        auVar27 = vunpcklpd_avx512f(auVar28,auVar30);
        auVar28 = vunpckhpd_avx512f(auVar28,auVar30);
        auVar30 = vunpcklpd_avx512f(auVar29,auVar31);
        auVar29 = vunpckhpd_avx512f(auVar29,auVar31);
        auVar31 = vunpcklpd_avx512f(auVar32,auVar34);
        auVar32 = vunpckhpd_avx512f(auVar32,auVar34);
        auVar34 = vunpcklpd_avx512f(auVar33,auVar35);
        auVar33 = vunpckhpd_avx512f(auVar33,auVar35);
        auVar35 = vshuff64x2_avx512f(auVar36,auVar23,0x88);
        auVar37 = vshuff64x2_avx512f(auVar27,auVar31,0x88);
        auVar38 = vshuff64x2_avx512f(auVar20,auVar24,0x88);
        auVar39 = vshuff64x2_avx512f(auVar28,auVar32,0x88);
        auVar40 = vshuff64x2_avx512f(auVar22,auVar26,0x88);
        auVar41 = vshuff64x2_avx512f(auVar30,auVar34,0x88);
        auVar42 = vshuff64x2_avx512f(auVar21,auVar25,0x88);
        auVar43 = vshuff64x2_avx512f(auVar29,auVar33,0x88);
        auVar23 = vshuff64x2_avx512f(auVar36,auVar23,0xdd);
        auVar27 = vshuff64x2_avx512f(auVar27,auVar31,0xdd);
        auVar20 = vshuff64x2_avx512f(auVar20,auVar24,0xdd);
        auVar24 = vshuff64x2_avx512f(auVar28,auVar32,0xdd);
        auVar22 = vshuff64x2_avx512f(auVar22,auVar26,0xdd);
        auVar26 = vshuff64x2_avx512f(auVar30,auVar34,0xdd);
        auVar21 = vshuff64x2_avx512f(auVar21,auVar25,0xdd);
        auVar25 = vshuff64x2_avx512f(auVar29,auVar33,0xdd);
        auVar28 = vshuff64x2_avx512f(auVar35,auVar37,0x88);
        auVar29 = vshuff64x2_avx512f(auVar38,auVar39,0x88);
        uStack_2c48 = auVar29._56_8_;
        uStack_2c50 = auVar29._48_8_;
        uStack_2c58 = auVar29._40_8_;
        uStack_2c60 = auVar29._32_8_;
        uStack_2c68 = auVar29._24_8_;
        uStack_2c70 = auVar29._16_8_;
        uStack_2c78 = auVar29._8_8_;
        local_2c80 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar40,auVar41,0x88);
        uStack_2c88 = auVar29._56_8_;
        uStack_2c90 = auVar29._48_8_;
        uStack_2c98 = auVar29._40_8_;
        uStack_2ca0 = auVar29._32_8_;
        uStack_2ca8 = auVar29._24_8_;
        uStack_2cb0 = auVar29._16_8_;
        uStack_2cb8 = auVar29._8_8_;
        local_2cc0 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar42,auVar43,0x88);
        uStack_2cc8 = auVar29._56_8_;
        uStack_2cd0 = auVar29._48_8_;
        uStack_2cd8 = auVar29._40_8_;
        uStack_2ce0 = auVar29._32_8_;
        uStack_2ce8 = auVar29._24_8_;
        uStack_2cf0 = auVar29._16_8_;
        uStack_2cf8 = auVar29._8_8_;
        local_2d00 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar23,auVar27,0x88);
        uStack_2d08 = auVar29._56_8_;
        uStack_2d10 = auVar29._48_8_;
        uStack_2d18 = auVar29._40_8_;
        uStack_2d20 = auVar29._32_8_;
        uStack_2d28 = auVar29._24_8_;
        uStack_2d30 = auVar29._16_8_;
        uStack_2d38 = auVar29._8_8_;
        local_2d40 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar20,auVar24,0x88);
        uStack_2d48 = auVar29._56_8_;
        uStack_2d50 = auVar29._48_8_;
        uStack_2d58 = auVar29._40_8_;
        uStack_2d60 = auVar29._32_8_;
        uStack_2d68 = auVar29._24_8_;
        uStack_2d70 = auVar29._16_8_;
        uStack_2d78 = auVar29._8_8_;
        local_2d80 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar22,auVar26,0x88);
        uStack_2d88 = auVar29._56_8_;
        uStack_2d90 = auVar29._48_8_;
        uStack_2d98 = auVar29._40_8_;
        uStack_2da0 = auVar29._32_8_;
        uStack_2da8 = auVar29._24_8_;
        uStack_2db0 = auVar29._16_8_;
        uStack_2db8 = auVar29._8_8_;
        local_2dc0 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar21,auVar25,0x88);
        uStack_2dc8 = auVar29._56_8_;
        uStack_2dd0 = auVar29._48_8_;
        uStack_2dd8 = auVar29._40_8_;
        uStack_2de0 = auVar29._32_8_;
        uStack_2de8 = auVar29._24_8_;
        uStack_2df0 = auVar29._16_8_;
        uStack_2df8 = auVar29._8_8_;
        local_2e00 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar35,auVar37,0xdd);
        uStack_2e08 = auVar29._56_8_;
        uStack_2e10 = auVar29._48_8_;
        uStack_2e18 = auVar29._40_8_;
        uStack_2e20 = auVar29._32_8_;
        uStack_2e28 = auVar29._24_8_;
        uStack_2e30 = auVar29._16_8_;
        uStack_2e38 = auVar29._8_8_;
        local_2e40 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar38,auVar39,0xdd);
        uStack_2e48 = auVar29._56_8_;
        uStack_2e50 = auVar29._48_8_;
        uStack_2e58 = auVar29._40_8_;
        uStack_2e60 = auVar29._32_8_;
        uStack_2e68 = auVar29._24_8_;
        uStack_2e70 = auVar29._16_8_;
        uStack_2e78 = auVar29._8_8_;
        local_2e80 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar40,auVar41,0xdd);
        uStack_2e88 = auVar29._56_8_;
        uStack_2e90 = auVar29._48_8_;
        uStack_2e98 = auVar29._40_8_;
        uStack_2ea0 = auVar29._32_8_;
        uStack_2ea8 = auVar29._24_8_;
        uStack_2eb0 = auVar29._16_8_;
        uStack_2eb8 = auVar29._8_8_;
        local_2ec0 = auVar29._0_8_;
        auVar29 = vshuff64x2_avx512f(auVar42,auVar43,0xdd);
        uStack_2ec8 = auVar29._56_8_;
        uStack_2ed0 = auVar29._48_8_;
        uStack_2ed8 = auVar29._40_8_;
        uStack_2ee0 = auVar29._32_8_;
        uStack_2ee8 = auVar29._24_8_;
        uStack_2ef0 = auVar29._16_8_;
        uStack_2ef8 = auVar29._8_8_;
        local_2f00 = auVar29._0_8_;
        auVar23 = vshuff64x2_avx512f(auVar23,auVar27,0xdd);
        uStack_2f08 = auVar23._56_8_;
        uStack_2f10 = auVar23._48_8_;
        uStack_2f18 = auVar23._40_8_;
        uStack_2f20 = auVar23._32_8_;
        uStack_2f28 = auVar23._24_8_;
        uStack_2f30 = auVar23._16_8_;
        uStack_2f38 = auVar23._8_8_;
        local_2f40 = auVar23._0_8_;
        auVar20 = vshuff64x2_avx512f(auVar20,auVar24,0xdd);
        uStack_2f48 = auVar20._56_8_;
        uStack_2f50 = auVar20._48_8_;
        uStack_2f58 = auVar20._40_8_;
        uStack_2f60 = auVar20._32_8_;
        uStack_2f68 = auVar20._24_8_;
        uStack_2f70 = auVar20._16_8_;
        uStack_2f78 = auVar20._8_8_;
        local_2f80 = auVar20._0_8_;
        auVar20 = vshuff64x2_avx512f(auVar22,auVar26,0xdd);
        uStack_2f88 = auVar20._56_8_;
        uStack_2f90 = auVar20._48_8_;
        uStack_2f98 = auVar20._40_8_;
        uStack_2fa0 = auVar20._32_8_;
        uStack_2fa8 = auVar20._24_8_;
        uStack_2fb0 = auVar20._16_8_;
        uStack_2fb8 = auVar20._8_8_;
        local_2fc0 = auVar20._0_8_;
        auVar20 = vshuff64x2_avx512f(auVar21,auVar25,0xdd);
        uStack_2c08 = auVar28._56_8_;
        uStack_2c10 = auVar28._48_8_;
        uStack_2c18 = auVar28._40_8_;
        uStack_2c20 = auVar28._32_8_;
        uStack_2c28 = auVar28._24_8_;
        uStack_2c30 = auVar28._16_8_;
        uStack_2c38 = auVar28._8_8_;
        local_2c40 = auVar28._0_8_;
        *(undefined8 *)*local_2b10 = local_2c40;
        *(undefined8 *)(*local_2b10 + 8) = uStack_2c38;
        *(undefined8 *)(*local_2b10 + 0x10) = uStack_2c30;
        *(undefined8 *)(*local_2b10 + 0x18) = uStack_2c28;
        *(undefined8 *)(*local_2b10 + 0x20) = uStack_2c20;
        *(undefined8 *)(*local_2b10 + 0x28) = uStack_2c18;
        *(undefined8 *)(*local_2b10 + 0x30) = uStack_2c10;
        *(undefined8 *)(*local_2b10 + 0x38) = uStack_2c08;
        *(undefined8 *)local_2b10[1] = local_2c80;
        *(undefined8 *)(local_2b10[1] + 8) = uStack_2c78;
        *(undefined8 *)(local_2b10[1] + 0x10) = uStack_2c70;
        *(undefined8 *)(local_2b10[1] + 0x18) = uStack_2c68;
        *(undefined8 *)(local_2b10[1] + 0x20) = uStack_2c60;
        *(undefined8 *)(local_2b10[1] + 0x28) = uStack_2c58;
        *(undefined8 *)(local_2b10[1] + 0x30) = uStack_2c50;
        *(undefined8 *)(local_2b10[1] + 0x38) = uStack_2c48;
        *(undefined8 *)local_2b10[2] = local_2cc0;
        *(undefined8 *)(local_2b10[2] + 8) = uStack_2cb8;
        *(undefined8 *)(local_2b10[2] + 0x10) = uStack_2cb0;
        *(undefined8 *)(local_2b10[2] + 0x18) = uStack_2ca8;
        *(undefined8 *)(local_2b10[2] + 0x20) = uStack_2ca0;
        *(undefined8 *)(local_2b10[2] + 0x28) = uStack_2c98;
        *(undefined8 *)(local_2b10[2] + 0x30) = uStack_2c90;
        *(undefined8 *)(local_2b10[2] + 0x38) = uStack_2c88;
        *(undefined8 *)local_2b10[3] = local_2d00;
        *(undefined8 *)(local_2b10[3] + 8) = uStack_2cf8;
        *(undefined8 *)(local_2b10[3] + 0x10) = uStack_2cf0;
        *(undefined8 *)(local_2b10[3] + 0x18) = uStack_2ce8;
        *(undefined8 *)(local_2b10[3] + 0x20) = uStack_2ce0;
        *(undefined8 *)(local_2b10[3] + 0x28) = uStack_2cd8;
        *(undefined8 *)(local_2b10[3] + 0x30) = uStack_2cd0;
        *(undefined8 *)(local_2b10[3] + 0x38) = uStack_2cc8;
        *(undefined8 *)local_2b10[4] = local_2d40;
        *(undefined8 *)(local_2b10[4] + 8) = uStack_2d38;
        *(undefined8 *)(local_2b10[4] + 0x10) = uStack_2d30;
        *(undefined8 *)(local_2b10[4] + 0x18) = uStack_2d28;
        *(undefined8 *)(local_2b10[4] + 0x20) = uStack_2d20;
        *(undefined8 *)(local_2b10[4] + 0x28) = uStack_2d18;
        *(undefined8 *)(local_2b10[4] + 0x30) = uStack_2d10;
        *(undefined8 *)(local_2b10[4] + 0x38) = uStack_2d08;
        *(undefined8 *)local_2b10[5] = local_2d80;
        *(undefined8 *)(local_2b10[5] + 8) = uStack_2d78;
        *(undefined8 *)(local_2b10[5] + 0x10) = uStack_2d70;
        *(undefined8 *)(local_2b10[5] + 0x18) = uStack_2d68;
        *(undefined8 *)(local_2b10[5] + 0x20) = uStack_2d60;
        *(undefined8 *)(local_2b10[5] + 0x28) = uStack_2d58;
        *(undefined8 *)(local_2b10[5] + 0x30) = uStack_2d50;
        *(undefined8 *)(local_2b10[5] + 0x38) = uStack_2d48;
        *(undefined8 *)local_2b10[6] = local_2dc0;
        *(undefined8 *)(local_2b10[6] + 8) = uStack_2db8;
        *(undefined8 *)(local_2b10[6] + 0x10) = uStack_2db0;
        *(undefined8 *)(local_2b10[6] + 0x18) = uStack_2da8;
        *(undefined8 *)(local_2b10[6] + 0x20) = uStack_2da0;
        *(undefined8 *)(local_2b10[6] + 0x28) = uStack_2d98;
        *(undefined8 *)(local_2b10[6] + 0x30) = uStack_2d90;
        *(undefined8 *)(local_2b10[6] + 0x38) = uStack_2d88;
        *(undefined8 *)local_2b10[7] = local_2e00;
        *(undefined8 *)(local_2b10[7] + 8) = uStack_2df8;
        *(undefined8 *)(local_2b10[7] + 0x10) = uStack_2df0;
        *(undefined8 *)(local_2b10[7] + 0x18) = uStack_2de8;
        *(undefined8 *)(local_2b10[7] + 0x20) = uStack_2de0;
        *(undefined8 *)(local_2b10[7] + 0x28) = uStack_2dd8;
        *(undefined8 *)(local_2b10[7] + 0x30) = uStack_2dd0;
        *(undefined8 *)(local_2b10[7] + 0x38) = uStack_2dc8;
        *(undefined8 *)local_2b10[8] = local_2e40;
        *(undefined8 *)(local_2b10[8] + 8) = uStack_2e38;
        *(undefined8 *)(local_2b10[8] + 0x10) = uStack_2e30;
        *(undefined8 *)(local_2b10[8] + 0x18) = uStack_2e28;
        *(undefined8 *)(local_2b10[8] + 0x20) = uStack_2e20;
        *(undefined8 *)(local_2b10[8] + 0x28) = uStack_2e18;
        *(undefined8 *)(local_2b10[8] + 0x30) = uStack_2e10;
        *(undefined8 *)(local_2b10[8] + 0x38) = uStack_2e08;
        *(undefined8 *)local_2b10[9] = local_2e80;
        *(undefined8 *)(local_2b10[9] + 8) = uStack_2e78;
        *(undefined8 *)(local_2b10[9] + 0x10) = uStack_2e70;
        *(undefined8 *)(local_2b10[9] + 0x18) = uStack_2e68;
        *(undefined8 *)(local_2b10[9] + 0x20) = uStack_2e60;
        *(undefined8 *)(local_2b10[9] + 0x28) = uStack_2e58;
        *(undefined8 *)(local_2b10[9] + 0x30) = uStack_2e50;
        *(undefined8 *)(local_2b10[9] + 0x38) = uStack_2e48;
        *(undefined8 *)local_2b10[10] = local_2ec0;
        *(undefined8 *)(local_2b10[10] + 8) = uStack_2eb8;
        *(undefined8 *)(local_2b10[10] + 0x10) = uStack_2eb0;
        *(undefined8 *)(local_2b10[10] + 0x18) = uStack_2ea8;
        *(undefined8 *)(local_2b10[10] + 0x20) = uStack_2ea0;
        *(undefined8 *)(local_2b10[10] + 0x28) = uStack_2e98;
        *(undefined8 *)(local_2b10[10] + 0x30) = uStack_2e90;
        *(undefined8 *)(local_2b10[10] + 0x38) = uStack_2e88;
        *(undefined8 *)local_2b10[0xb] = local_2f00;
        *(undefined8 *)(local_2b10[0xb] + 8) = uStack_2ef8;
        *(undefined8 *)(local_2b10[0xb] + 0x10) = uStack_2ef0;
        *(undefined8 *)(local_2b10[0xb] + 0x18) = uStack_2ee8;
        *(undefined8 *)(local_2b10[0xb] + 0x20) = uStack_2ee0;
        *(undefined8 *)(local_2b10[0xb] + 0x28) = uStack_2ed8;
        *(undefined8 *)(local_2b10[0xb] + 0x30) = uStack_2ed0;
        *(undefined8 *)(local_2b10[0xb] + 0x38) = uStack_2ec8;
        *(undefined8 *)local_2b10[0xc] = local_2f40;
        *(undefined8 *)(local_2b10[0xc] + 8) = uStack_2f38;
        *(undefined8 *)(local_2b10[0xc] + 0x10) = uStack_2f30;
        *(undefined8 *)(local_2b10[0xc] + 0x18) = uStack_2f28;
        *(undefined8 *)(local_2b10[0xc] + 0x20) = uStack_2f20;
        *(undefined8 *)(local_2b10[0xc] + 0x28) = uStack_2f18;
        *(undefined8 *)(local_2b10[0xc] + 0x30) = uStack_2f10;
        *(undefined8 *)(local_2b10[0xc] + 0x38) = uStack_2f08;
        *(undefined8 *)local_2b10[0xd] = local_2f80;
        *(undefined8 *)(local_2b10[0xd] + 8) = uStack_2f78;
        *(undefined8 *)(local_2b10[0xd] + 0x10) = uStack_2f70;
        *(undefined8 *)(local_2b10[0xd] + 0x18) = uStack_2f68;
        *(undefined8 *)(local_2b10[0xd] + 0x20) = uStack_2f60;
        *(undefined8 *)(local_2b10[0xd] + 0x28) = uStack_2f58;
        *(undefined8 *)(local_2b10[0xd] + 0x30) = uStack_2f50;
        *(undefined8 *)(local_2b10[0xd] + 0x38) = uStack_2f48;
        *(undefined8 *)local_2b10[0xe] = local_2fc0;
        *(undefined8 *)(local_2b10[0xe] + 8) = uStack_2fb8;
        *(undefined8 *)(local_2b10[0xe] + 0x10) = uStack_2fb0;
        *(undefined8 *)(local_2b10[0xe] + 0x18) = uStack_2fa8;
        *(undefined8 *)(local_2b10[0xe] + 0x20) = uStack_2fa0;
        *(undefined8 *)(local_2b10[0xe] + 0x28) = uStack_2f98;
        *(undefined8 *)(local_2b10[0xe] + 0x30) = uStack_2f90;
        *(undefined8 *)(local_2b10[0xe] + 0x38) = uStack_2f88;
        local_2b10[0xf] = auVar20;
        local_2b10 = local_2b10 + 0x10;
        local_2b70 = local_2b70 + 1;
        local_2b78 = local_2b78 + 1;
        local_2b80 = local_2b80 + 1;
        local_2b88 = local_2b88 + 1;
        local_2b90 = local_2b90 + 1;
        local_2b98 = local_2b98 + 1;
        local_2ba0 = local_2ba0 + 1;
        local_2ba8 = local_2ba8 + 1;
        local_2bb0 = local_2bb0 + 1;
        local_2bb8 = local_2bb8 + 1;
        local_2bc0 = local_2bc0 + 1;
        local_2bc8 = local_2bc8 + 1;
        local_2bd0 = local_2bd0 + 1;
        local_2bd8 = local_2bd8 + 1;
        local_2be0 = local_2be0 + 1;
        local_2be8 = local_2be8 + 1;
      }
      for (; local_2bec < in_R9D; local_2bec = local_2bec + 1) {
        *(undefined4 *)*local_2b10 = *(undefined4 *)*local_2b70;
        *(undefined4 *)(*local_2b10 + 4) = *(undefined4 *)*local_2b78;
        *(undefined4 *)(*local_2b10 + 8) = *(undefined4 *)*local_2b80;
        *(undefined4 *)(*local_2b10 + 0xc) = *(undefined4 *)*local_2b88;
        *(undefined4 *)(*local_2b10 + 0x10) = *(undefined4 *)*local_2b90;
        *(undefined4 *)(*local_2b10 + 0x14) = *(undefined4 *)*local_2b98;
        *(undefined4 *)(*local_2b10 + 0x18) = *(undefined4 *)*local_2ba0;
        *(undefined4 *)(*local_2b10 + 0x1c) = *(undefined4 *)*local_2ba8;
        *(undefined4 *)(*local_2b10 + 0x20) = *(undefined4 *)*local_2bb0;
        *(undefined4 *)(*local_2b10 + 0x24) = *(undefined4 *)*local_2bb8;
        *(undefined4 *)(*local_2b10 + 0x28) = *(undefined4 *)*local_2bc0;
        *(undefined4 *)(*local_2b10 + 0x2c) = *(undefined4 *)*local_2bc8;
        *(undefined4 *)(*local_2b10 + 0x30) = *(undefined4 *)*local_2bd0;
        *(undefined4 *)(*local_2b10 + 0x34) = *(undefined4 *)*local_2bd8;
        *(undefined4 *)(*local_2b10 + 0x38) = *(undefined4 *)*local_2be0;
        *(undefined4 *)(*local_2b10 + 0x3c) = *(undefined4 *)*local_2be8;
        local_2b10 = local_2b10 + 1;
        local_2b70 = (undefined1 (*) [64])(*local_2b70 + 4);
        local_2b78 = (undefined1 (*) [64])(*local_2b78 + 4);
        local_2b80 = (undefined1 (*) [64])(*local_2b80 + 4);
        local_2b88 = (undefined1 (*) [64])(*local_2b88 + 4);
        local_2b90 = (undefined1 (*) [64])(*local_2b90 + 4);
        local_2b98 = (undefined1 (*) [64])(*local_2b98 + 4);
        local_2ba0 = (undefined1 (*) [64])(*local_2ba0 + 4);
        local_2ba8 = (undefined1 (*) [64])(*local_2ba8 + 4);
        local_2bb0 = (undefined1 (*) [64])(*local_2bb0 + 4);
        local_2bb8 = (undefined1 (*) [64])(*local_2bb8 + 4);
        local_2bc0 = (undefined1 (*) [64])(*local_2bc0 + 4);
        local_2bc8 = (undefined1 (*) [64])(*local_2bc8 + 4);
        local_2bd0 = (undefined1 (*) [64])(*local_2bd0 + 4);
        local_2bd8 = (undefined1 (*) [64])(*local_2bd8 + 4);
        local_2be0 = (undefined1 (*) [64])(*local_2be0 + 4);
        local_2be8 = (undefined1 (*) [64])(*local_2be8 + 4);
      }
    }
  }
  for (; local_2b14 + 7 < in_ECX; local_2b14 = local_2b14 + 8) {
    if (iVar1 == 8) {
      local_3008 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 3) * 4);
      for (local_300c = 0; local_300c < in_R9D; local_300c = local_300c + 1) {
        *(undefined1 (*) [32])*local_2b10 = *local_3008;
        local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x20);
        local_3008 = local_3008 + 1;
      }
    }
    if (iVar1 == 4) {
      local_3018 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_3020 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 4) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_3024 = 0; local_3024 < in_R9D; local_3024 = local_3024 + 1) {
        uVar17 = local_3018[1];
        *(undefined8 *)*local_2b10 = *local_3018;
        *(undefined8 *)(*local_2b10 + 8) = uVar17;
        *(undefined1 (*) [16])(*local_2b10 + 0x10) = *local_3020;
        local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x20);
        local_3018 = local_3018 + 2;
        local_3020 = local_3020 + 1;
      }
    }
    if (iVar1 == 1) {
      local_3030 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 + (long)in_R8D * 4);
      local_3038 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 1) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3040 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 2) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3048 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 3) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3050 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 4) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3058 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 5) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3060 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 6) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_3068 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 7) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      for (local_306c = 0; local_306c + 7 < in_R9D; local_306c = local_306c + 8) {
        auVar13 = vunpcklps_avx(*local_3030,*local_3038);
        auVar4 = vunpckhps_avx(*local_3030,*local_3038);
        auVar14 = vunpcklps_avx(*local_3040,*local_3048);
        auVar5 = vunpckhps_avx(*local_3040,*local_3048);
        auVar15 = vunpcklps_avx(*local_3050,*local_3058);
        auVar6 = vunpckhps_avx(*local_3050,*local_3058);
        auVar16 = vunpcklps_avx(*local_3060,*local_3068);
        auVar7 = vunpckhps_avx(*local_3060,*local_3068);
        auVar9 = vunpcklpd_avx(auVar13,auVar14);
        auVar13 = vunpckhpd_avx(auVar13,auVar14);
        auVar14 = vunpcklpd_avx(auVar4,auVar5);
        auVar4 = vunpckhpd_avx(auVar4,auVar5);
        auVar10 = vunpcklpd_avx(auVar15,auVar16);
        auVar5 = vunpckhpd_avx(auVar15,auVar16);
        auVar15 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar7 = vperm2f128_avx(auVar9,auVar10,0x20);
        auVar16 = vperm2f128_avx(auVar13,auVar5,0x20);
        uStack_30a8 = auVar16._24_8_;
        uStack_30b0 = auVar16._16_8_;
        uStack_30b8 = auVar16._8_8_;
        local_30c0 = auVar16._0_8_;
        auVar16 = vperm2f128_avx(auVar14,auVar15,0x20);
        uStack_30c8 = auVar16._24_8_;
        uStack_30d0 = auVar16._16_8_;
        uStack_30d8 = auVar16._8_8_;
        local_30e0 = auVar16._0_8_;
        auVar16 = vperm2f128_avx(auVar4,auVar6,0x20);
        uStack_30e8 = auVar16._24_8_;
        uStack_30f0 = auVar16._16_8_;
        uStack_30f8 = auVar16._8_8_;
        local_3100 = auVar16._0_8_;
        auVar9 = vperm2f128_avx(auVar9,auVar10,0x31);
        uStack_3108 = auVar9._24_8_;
        uStack_3110 = auVar9._16_8_;
        uStack_3118 = auVar9._8_8_;
        local_3120 = auVar9._0_8_;
        auVar13 = vperm2f128_avx(auVar13,auVar5,0x31);
        uStack_3128 = auVar13._24_8_;
        uStack_3130 = auVar13._16_8_;
        uStack_3138 = auVar13._8_8_;
        local_3140 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar14,auVar15,0x31);
        uStack_3148 = auVar13._24_8_;
        uStack_3150 = auVar13._16_8_;
        uStack_3158 = auVar13._8_8_;
        local_3160 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar4,auVar6,0x31);
        uStack_3088 = auVar7._24_8_;
        uStack_3090 = auVar7._16_8_;
        uStack_3098 = auVar7._8_8_;
        local_30a0 = auVar7._0_8_;
        *(undefined8 *)*local_2b10 = local_30a0;
        *(undefined8 *)(*local_2b10 + 8) = uStack_3098;
        *(undefined8 *)(*local_2b10 + 0x10) = uStack_3090;
        *(undefined8 *)(*local_2b10 + 0x18) = uStack_3088;
        *(undefined8 *)(*local_2b10 + 0x20) = local_30c0;
        *(undefined8 *)(*local_2b10 + 0x28) = uStack_30b8;
        *(undefined8 *)(*local_2b10 + 0x30) = uStack_30b0;
        *(undefined8 *)(*local_2b10 + 0x38) = uStack_30a8;
        *(undefined8 *)local_2b10[1] = local_30e0;
        *(undefined8 *)(local_2b10[1] + 8) = uStack_30d8;
        *(undefined8 *)(local_2b10[1] + 0x10) = uStack_30d0;
        *(undefined8 *)(local_2b10[1] + 0x18) = uStack_30c8;
        *(undefined8 *)(local_2b10[1] + 0x20) = local_3100;
        *(undefined8 *)(local_2b10[1] + 0x28) = uStack_30f8;
        *(undefined8 *)(local_2b10[1] + 0x30) = uStack_30f0;
        *(undefined8 *)(local_2b10[1] + 0x38) = uStack_30e8;
        *(undefined8 *)local_2b10[2] = local_3120;
        *(undefined8 *)(local_2b10[2] + 8) = uStack_3118;
        *(undefined8 *)(local_2b10[2] + 0x10) = uStack_3110;
        *(undefined8 *)(local_2b10[2] + 0x18) = uStack_3108;
        *(undefined8 *)(local_2b10[2] + 0x20) = local_3140;
        *(undefined8 *)(local_2b10[2] + 0x28) = uStack_3138;
        *(undefined8 *)(local_2b10[2] + 0x30) = uStack_3130;
        *(undefined8 *)(local_2b10[2] + 0x38) = uStack_3128;
        *(undefined8 *)local_2b10[3] = local_3160;
        *(undefined8 *)(local_2b10[3] + 8) = uStack_3158;
        *(undefined8 *)(local_2b10[3] + 0x10) = uStack_3150;
        *(undefined8 *)(local_2b10[3] + 0x18) = uStack_3148;
        *(undefined1 (*) [32])(local_2b10[3] + 0x20) = auVar13;
        local_2b10 = local_2b10 + 4;
        local_3030 = local_3030 + 1;
        local_3038 = local_3038 + 1;
        local_3040 = local_3040 + 1;
        local_3048 = local_3048 + 1;
        local_3050 = local_3050 + 1;
        local_3058 = local_3058 + 1;
        local_3060 = local_3060 + 1;
        local_3068 = local_3068 + 1;
      }
      for (; local_306c < in_R9D; local_306c = local_306c + 1) {
        *(undefined4 *)*local_2b10 = *(undefined4 *)*local_3030;
        *(undefined4 *)(*local_2b10 + 4) = *(undefined4 *)*local_3038;
        *(undefined4 *)(*local_2b10 + 8) = *(undefined4 *)*local_3040;
        *(undefined4 *)(*local_2b10 + 0xc) = *(undefined4 *)*local_3048;
        *(undefined4 *)(*local_2b10 + 0x10) = *(undefined4 *)*local_3050;
        *(undefined4 *)(*local_2b10 + 0x14) = *(undefined4 *)*local_3058;
        *(undefined4 *)(*local_2b10 + 0x18) = *(undefined4 *)*local_3060;
        *(undefined4 *)(*local_2b10 + 0x1c) = *(undefined4 *)*local_3068;
        local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x20);
        local_3030 = (undefined1 (*) [32])(*local_3030 + 4);
        local_3038 = (undefined1 (*) [32])(*local_3038 + 4);
        local_3040 = (undefined1 (*) [32])(*local_3040 + 4);
        local_3048 = (undefined1 (*) [32])(*local_3048 + 4);
        local_3050 = (undefined1 (*) [32])(*local_3050 + 4);
        local_3058 = (undefined1 (*) [32])(*local_3058 + 4);
        local_3060 = (undefined1 (*) [32])(*local_3060 + 4);
        local_3068 = (undefined1 (*) [32])(*local_3068 + 4);
      }
    }
  }
  for (; local_2b14 + 3 < in_ECX; local_2b14 = local_2b14 + 4) {
    if (iVar1 == 4) {
      local_3188 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_318c = 0; local_318c < in_R9D; local_318c = local_318c + 1) {
        *(undefined1 (*) [16])*local_2b10 = *local_3188;
        local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x10);
        local_3188 = local_3188 + 1;
      }
    }
    if (iVar1 == 1) {
      local_3198 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 + (long)in_R8D * 4);
      local_31a0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 1) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_31a8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 2) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      local_31b0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2b14 + 3) * local_3370) * 4 + (long)in_R8D * 4)
      ;
      for (local_31b4 = 0; local_31b4 + 7 < in_R9D; local_31b4 = local_31b4 + 8) {
        auVar13 = vunpcklps_avx(*local_3198,*local_31a0);
        auVar4 = vunpckhps_avx(*local_3198,*local_31a0);
        auVar7 = vunpcklps_avx(*local_31a8,*local_31b0);
        auVar5 = vunpckhps_avx(*local_31a8,*local_31b0);
        auVar6 = vunpcklpd_avx(auVar13,auVar7);
        auVar13 = vunpckhpd_avx(auVar13,auVar7);
        auVar7 = vunpcklpd_avx(auVar4,auVar5);
        auVar4 = vunpckhpd_avx(auVar4,auVar5);
        auVar5 = vperm2f128_avx(auVar6,auVar13,0x20);
        auVar9 = vperm2f128_avx(auVar7,auVar4,0x20);
        uStack_31e8 = auVar9._24_8_;
        uStack_31f0 = auVar9._16_8_;
        uStack_31f8 = auVar9._8_8_;
        local_3200 = auVar9._0_8_;
        auVar13 = vperm2f128_avx(auVar6,auVar13,0x31);
        uStack_3208 = auVar13._24_8_;
        uStack_3210 = auVar13._16_8_;
        uStack_3218 = auVar13._8_8_;
        local_3220 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar7,auVar4,0x31);
        uStack_31c8 = auVar5._24_8_;
        uStack_31d0 = auVar5._16_8_;
        uStack_31d8 = auVar5._8_8_;
        local_31e0 = auVar5._0_8_;
        *(undefined8 *)*local_2b10 = local_31e0;
        *(undefined8 *)(*local_2b10 + 8) = uStack_31d8;
        *(undefined8 *)(*local_2b10 + 0x10) = uStack_31d0;
        *(undefined8 *)(*local_2b10 + 0x18) = uStack_31c8;
        *(undefined8 *)(*local_2b10 + 0x20) = local_3200;
        *(undefined8 *)(*local_2b10 + 0x28) = uStack_31f8;
        *(undefined8 *)(*local_2b10 + 0x30) = uStack_31f0;
        *(undefined8 *)(*local_2b10 + 0x38) = uStack_31e8;
        *(undefined8 *)local_2b10[1] = local_3220;
        *(undefined8 *)(local_2b10[1] + 8) = uStack_3218;
        *(undefined8 *)(local_2b10[1] + 0x10) = uStack_3210;
        *(undefined8 *)(local_2b10[1] + 0x18) = uStack_3208;
        *(undefined1 (*) [32])(local_2b10[1] + 0x20) = auVar13;
        local_2b10 = local_2b10 + 2;
        local_3198 = local_3198 + 1;
        local_31a0 = local_31a0 + 1;
        local_31a8 = local_31a8 + 1;
        local_31b0 = local_31b0 + 1;
      }
      for (; local_31b4 + 3 < in_R9D; local_31b4 = local_31b4 + 4) {
        auVar11 = vunpcklps_avx(*(undefined1 (*) [16])*local_3198,*(undefined1 (*) [16])*local_31a0)
        ;
        auVar12 = vunpcklps_avx(*(undefined1 (*) [16])*local_31a8,*(undefined1 (*) [16])*local_31b0)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_3198,*(undefined1 (*) [16])*local_31a0);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_31a8,*(undefined1 (*) [16])*local_31b0);
        auVar8 = vunpcklpd_avx(auVar11,auVar12);
        auVar11 = vunpckhpd_avx(auVar11,auVar12);
        auVar12 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_3250 = auVar8._0_8_;
        uStack_3248 = auVar8._8_8_;
        *(undefined8 *)*local_2b10 = local_3250;
        *(undefined8 *)(*local_2b10 + 8) = uStack_3248;
        local_3260 = auVar11._0_8_;
        uStack_3258 = auVar11._8_8_;
        *(undefined8 *)(*local_2b10 + 0x10) = local_3260;
        *(undefined8 *)(*local_2b10 + 0x18) = uStack_3258;
        local_3270 = auVar12._0_8_;
        uStack_3268 = auVar12._8_8_;
        *(undefined8 *)(*local_2b10 + 0x20) = local_3270;
        *(undefined8 *)(*local_2b10 + 0x28) = uStack_3268;
        *(undefined1 (*) [16])(*local_2b10 + 0x30) = auVar2;
        local_2b10 = local_2b10 + 1;
        local_3198 = (undefined1 (*) [32])(*local_3198 + 0x10);
        local_31a0 = (undefined1 (*) [32])(*local_31a0 + 0x10);
        local_31a8 = (undefined1 (*) [32])(*local_31a8 + 0x10);
        local_31b0 = (undefined1 (*) [32])(*local_31b0 + 0x10);
      }
      for (; local_31b4 < in_R9D; local_31b4 = local_31b4 + 1) {
        *(undefined4 *)*local_2b10 = *(undefined4 *)*local_3198;
        *(undefined4 *)(*local_2b10 + 4) = *(undefined4 *)*local_31a0;
        *(undefined4 *)(*local_2b10 + 8) = *(undefined4 *)*local_31a8;
        *(undefined4 *)(*local_2b10 + 0xc) = *(undefined4 *)*local_31b0;
        local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x10);
        local_3198 = (undefined1 (*) [32])(*local_3198 + 4);
        local_31a0 = (undefined1 (*) [32])(*local_31a0 + 4);
        local_31a8 = (undefined1 (*) [32])(*local_31a8 + 4);
        local_31b0 = (undefined1 (*) [32])(*local_31b0 + 4);
      }
    }
  }
  for (; local_2b14 + 1 < in_ECX; local_2b14 = local_2b14 + 2) {
    local_32c8 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 + (long)in_R8D * 4);
    local_32d0 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2b14 + 1) * local_3370) * 4 + (long)in_R8D * 4);
    for (local_32d4 = 0; local_32d4 + 7 < in_R9D; local_32d4 = local_32d4 + 8) {
      auVar4 = vunpcklps_avx(*local_32c8,*local_32d0);
      auVar13 = vunpckhps_avx(*local_32c8,*local_32d0);
      auVar5 = vperm2f128_avx(auVar4,auVar13,0x20);
      auVar13 = vperm2f128_avx(auVar4,auVar13,0x31);
      uStack_32e8 = auVar5._24_8_;
      uStack_32f0 = auVar5._16_8_;
      uStack_32f8 = auVar5._8_8_;
      local_3300 = auVar5._0_8_;
      *(undefined8 *)*local_2b10 = local_3300;
      *(undefined8 *)(*local_2b10 + 8) = uStack_32f8;
      *(undefined8 *)(*local_2b10 + 0x10) = uStack_32f0;
      *(undefined8 *)(*local_2b10 + 0x18) = uStack_32e8;
      *(undefined1 (*) [32])(*local_2b10 + 0x20) = auVar13;
      local_2b10 = local_2b10 + 1;
      local_32c8 = local_32c8 + 1;
      local_32d0 = local_32d0 + 1;
    }
    for (; local_32d4 + 3 < in_R9D; local_32d4 = local_32d4 + 4) {
      auVar2 = vunpcklps_avx(*(undefined1 (*) [16])*local_32c8,*(undefined1 (*) [16])*local_32d0);
      auVar11 = vunpckhps_avx(*(undefined1 (*) [16])*local_32c8,*(undefined1 (*) [16])*local_32d0);
      local_3350 = auVar2._0_8_;
      uStack_3348 = auVar2._8_8_;
      *(undefined8 *)*local_2b10 = local_3350;
      *(undefined8 *)(*local_2b10 + 8) = uStack_3348;
      *(undefined1 (*) [16])(*local_2b10 + 0x10) = auVar11;
      local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x20);
      local_32c8 = (undefined1 (*) [32])(*local_32c8 + 0x10);
      local_32d0 = (undefined1 (*) [32])(*local_32d0 + 0x10);
    }
    for (; local_32d4 < in_R9D; local_32d4 = local_32d4 + 1) {
      *(undefined4 *)*local_2b10 = *(undefined4 *)*local_32c8;
      *(undefined4 *)(*local_2b10 + 4) = *(undefined4 *)*local_32d0;
      local_2b10 = (undefined1 (*) [64])(*local_2b10 + 8);
      local_32c8 = (undefined1 (*) [32])(*local_32c8 + 4);
      local_32d0 = (undefined1 (*) [32])(*local_32d0 + 4);
    }
  }
  for (; local_2b14 < in_ECX; local_2b14 = local_2b14 + 1) {
    local_3368 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2b14) * local_3370) * 4 + (long)in_R8D * 4);
    for (local_336c = 0; local_336c + 7 < in_R9D; local_336c = local_336c + 8) {
      *(undefined1 (*) [32])*local_2b10 = *local_3368;
      local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x20);
      local_3368 = local_3368 + 1;
    }
    for (; local_336c + 3 < in_R9D; local_336c = local_336c + 4) {
      *(undefined1 (*) [16])*local_2b10 = *(undefined1 (*) [16])*local_3368;
      local_2b10 = (undefined1 (*) [64])(*local_2b10 + 0x10);
      local_3368 = (undefined1 (*) [32])(*local_3368 + 0x10);
    }
    for (; local_336c < in_R9D; local_336c = local_336c + 1) {
      *(undefined4 *)*local_2b10 = *(undefined4 *)*local_3368;
      local_2b10 = (undefined1 (*) [64])(*local_2b10 + 4);
      local_3368 = (undefined1 (*) [32])(*local_3368 + 4);
    }
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}